

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olf.h
# Opt level: O3

void __thiscall OLF<4U>::OLF(OLF<4U> *this,int num,int _HIT)

{
  (this->super_Abstract<4U>).name._M_dataplus._M_p =
       (pointer)&(this->super_Abstract<4U>).name.field_2;
  (this->super_Abstract<4U>).name._M_string_length = 0;
  (this->super_Abstract<4U>).name.field_2._M_local_buf[0] = '\0';
  (this->super_Abstract<4U>).sep._M_dataplus._M_p = (pointer)&(this->super_Abstract<4U>).sep.field_2
  ;
  (this->super_Abstract<4U>).sep._M_string_length = 0;
  (this->super_Abstract<4U>).sep.field_2._M_local_buf[0] = '\0';
  (this->super_Abstract<4U>)._vptr_Abstract = (_func_int **)&PTR_Init_00111c40;
  (this->mp)._M_h._M_buckets = &(this->mp)._M_h._M_single_bucket;
  (this->mp)._M_h._M_bucket_count = 1;
  (this->mp)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->mp)._M_h._M_element_count = 0;
  (this->mp)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->mp)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->mp)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->sp)._M_h._M_buckets = &(this->sp)._M_h._M_single_bucket;
  (this->sp)._M_h._M_bucket_count = 1;
  (this->sp)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->sp)._M_h._M_element_count = 0;
  (this->sp)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->sp)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->sp)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->super_Abstract<4U>).HIT = _HIT;
  (this->super_Abstract<4U>).pr = 0.0;
  (this->super_Abstract<4U>).cr = 0.0;
  (this->super_Abstract<4U>).aae = 0.0;
  (this->super_Abstract<4U>).are = 0.0;
  std::__cxx11::string::_M_replace((ulong)&(this->super_Abstract<4U>).name,0,(char *)0x0,0x10c867);
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_Abstract<4U>).sep,0,
             (char *)(this->super_Abstract<4U>).sep._M_string_length,0x10c863);
  this->epsilon = (double)(num / 100000) * 0.0011;
  return;
}

Assistant:

OLF(int num, int _HIT) {
		this->HIT = _HIT;
		this->aae = this->are = this->pr = this->cr = 0;
		this->name = "OLF";
		this->sep = "\t\t\t";
		epsilon = num / 100000 * 0.0011;
	}